

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

iterator * __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
::iterator::operator++(iterator *this)

{
  AssertIsFull(this->ctrl_,'\0',(GenerationType *)0x0,"operator++");
  this->ctrl_ = this->ctrl_ + 1;
  (this->field_1).slot_ = (this->field_1).slot_ + 1;
  skip_empty_or_deleted(this);
  if (*this->ctrl_ == kSentinel) {
    this->ctrl_ = (ctrl_t *)0x0;
  }
  return this;
}

Assistant:

iterator& operator++() {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator++");
      ++ctrl_;
      ++slot_;
      skip_empty_or_deleted();
      if (ABSL_PREDICT_FALSE(*ctrl_ == ctrl_t::kSentinel)) ctrl_ = nullptr;
      return *this;
    }